

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O0

Map_Time_t * Abc_NtkMapCopyCiArrival(Abc_Ntk_t *pNtk,Abc_Time_t *ppTimes)

{
  int iVar1;
  Map_Time_t *pMVar2;
  float fVar3;
  int local_24;
  int i;
  Map_Time_t *p;
  Abc_Time_t *ppTimes_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCiNum(pNtk);
  pMVar2 = (Map_Time_t *)calloc((long)iVar1,0xc);
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pMVar2[local_24].Fall = ppTimes[local_24].Fall;
    pMVar2[local_24].Rise = ppTimes[local_24].Rise;
    fVar3 = Abc_MaxFloat(pMVar2[local_24].Fall,pMVar2[local_24].Rise);
    pMVar2[local_24].Worst = fVar3;
  }
  if (ppTimes != (Abc_Time_t *)0x0) {
    free(ppTimes);
  }
  return pMVar2;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCiArrival( Abc_Ntk_t * pNtk, Abc_Time_t * ppTimes )
{
    Map_Time_t * p;
    int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCiNum(pNtk) );
    for ( i = 0; i < Abc_NtkCiNum(pNtk); i++ )
    {
        p[i].Fall = ppTimes[i].Fall;
        p[i].Rise = ppTimes[i].Rise;
        p[i].Worst = Abc_MaxFloat( p[i].Fall, p[i].Rise );
    }
    ABC_FREE( ppTimes );
    return p;
}